

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrelationaltablemodel.cpp
# Opt level: O3

void __thiscall
QSqlRelationalTableModelPrivate::translateFieldNames
          (QSqlRelationalTableModelPrivate *this,QSqlRecord *values)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  bool bVar5;
  anon_union_24_3_e3d07ef4_for_data local_80;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = QSqlRecord::count(values);
  if (0 < iVar2) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      QList<QSharedPointer<QRelation>_>::value
                ((QList<QSharedPointer<QRelation>_> *)&local_80,(qsizetype)&this->relations);
      if (local_80.shared == (PrivateShared *)0x0) {
        QSharedPointer<QRelation>::deref((Data *)local_80._8_8_);
      }
      else {
        lVar1 = *(long *)((long)&(((this->relations).d.ptr)->value).ptr + lVar4);
        if ((*(long *)(lVar1 + 0x10) == 0) || (*(long *)(lVar1 + 0x28) == 0)) {
          bVar5 = false;
        }
        else {
          bVar5 = *(long *)(lVar1 + 0x40) != 0;
        }
        lVar1 = *(long *)(lVar1 + 0x58);
        QSharedPointer<QRelation>::deref((Data *)local_80._8_8_);
        if ((bVar5) && (lVar1 != 0)) {
          local_58._16_8_ = 0xaaaaaaaaaaaaaaaa;
          uStack_40 = 0xaaaaaaaaaaaaaaaa;
          local_58.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
          local_58._8_8_ = 0xaaaaaaaaaaaaaaaa;
          iVar2 = (int)lVar3;
          QSqlRecord::value((QVariant *)&local_58,values,iVar2);
          bVar5 = QSqlRecord::isGenerated(values,iVar2);
          QSqlRecord::field((QSqlField *)&local_80,&this->baseRec,iVar2);
          QSqlRecord::replace(values,iVar2,(QSqlField *)&local_80);
          QSqlField::~QSqlField((QSqlField *)&local_80);
          QSqlRecord::setValue(values,iVar2,(QVariant *)&local_58);
          QSqlRecord::setGenerated(values,iVar2,bVar5);
          QVariant::~QVariant((QVariant *)&local_58);
        }
      }
      lVar3 = lVar3 + 1;
      iVar2 = QSqlRecord::count(values);
      lVar4 = lVar4 + 0x10;
    } while (lVar3 < iVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSqlRelationalTableModelPrivate::translateFieldNames(QSqlRecord &values) const
{
    for (int i = 0; i < values.count(); ++i) {
        if (relations.value(i) && relations.at(i)->isValid()) {
            QVariant v = values.value(i);
            bool gen = values.isGenerated(i);
            values.replace(i, baseRec.field(i));
            values.setValue(i, v);
            values.setGenerated(i, gen);
        }
    }
}